

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmSourceGroup * __thiscall
cmMakefile::GetSourceGroup
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *name)

{
  bool bVar1;
  __type _Var2;
  reference this_00;
  string *__lhs;
  size_type sVar3;
  const_reference pvVar4;
  uint local_4c;
  uint i;
  string *sgName;
  cmSourceGroup *srcGroup;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *__range1;
  cmSourceGroup *sg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *name_local;
  cmMakefile *this_local;
  
  __range1 = (vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)0x0;
  __end1 = std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::begin(&this->SourceGroups);
  srcGroup = (cmSourceGroup *)
             std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::end(&this->SourceGroups);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
                                     *)&srcGroup), this_00 = (reference)__range1, bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
              ::operator*(&__end1);
    __lhs = cmSourceGroup::GetName_abi_cxx11_(this_00);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](name,0);
    _Var2 = std::operator==(__lhs,pvVar4);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<const_cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
    ::operator++(&__end1);
  }
  __range1 = (vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)this_00;
  if (__range1 != (vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)0x0) {
    for (local_4c = 1;
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(name), local_4c < sVar3; local_4c = local_4c + 1) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](name,(ulong)local_4c);
      __range1 = (vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)
                 cmSourceGroup::LookupChild((cmSourceGroup *)__range1,pvVar4);
      if ((cmSourceGroup *)__range1 == (cmSourceGroup *)0x0) {
        return (cmSourceGroup *)0x0;
      }
    }
  }
  return (cmSourceGroup *)__range1;
}

Assistant:

cmSourceGroup* cmMakefile::GetSourceGroup(
  const std::vector<std::string>& name) const
{
  cmSourceGroup* sg = nullptr;

  // first look for source group starting with the same as the one we want
  for (cmSourceGroup const& srcGroup : this->SourceGroups) {
    std::string const& sgName = srcGroup.GetName();
    if (sgName == name[0]) {
      sg = const_cast<cmSourceGroup*>(&srcGroup);
      break;
    }
  }

  if (sg != nullptr) {
    // iterate through its children to find match source group
    for (unsigned int i = 1; i < name.size(); ++i) {
      sg = sg->LookupChild(name[i]);
      if (sg == nullptr) {
        break;
      }
    }
  }
  return sg;
}